

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

string * __thiscall
flatbuffers::FlatBufMethod::GRPCType_abi_cxx11_
          (string *__return_storage_ptr__,FlatBufMethod *this,StructDef *sd)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  StructDef *local_20;
  StructDef *sd_local;
  FlatBufMethod *this_local;
  
  local_20 = sd;
  sd_local = (StructDef *)this;
  this_local = (FlatBufMethod *)__return_storage_ptr__;
  std::operator+(&local_40,"flatbuffers::grpc::Message<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sd);
  std::operator+(__return_storage_ptr__,&local_40,">");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GRPCType(const StructDef &sd) const {
    return "flatbuffers::grpc::Message<" + sd.name + ">";
  }